

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  stbtt__buf sVar14;
  
  puVar6 = b.data;
  uVar3 = b._8_8_ >> 0x20;
  uVar2 = b.size;
  uVar5 = (int)uVar2 >> 0x1f & uVar2;
  uVar1 = 0;
  iVar8 = 2;
  do {
    if ((int)uVar5 < (int)uVar2) {
      lVar11 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      uVar10 = (uint)puVar6[lVar11];
    }
    else {
      uVar10 = 0;
    }
    uVar1 = uVar1 << 8 | uVar10;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  uVar10 = 0;
  if ((int)uVar5 < (int)uVar2) {
    uVar9 = 0;
    uVar12 = 0;
    uVar10 = 0;
    if (puVar6[(int)uVar5] != 0) {
      uVar10 = (uint)puVar6[(int)uVar5];
      uVar5 = uVar5 + i * uVar10 + 1;
      uVar4 = (ulong)uVar5;
      if ((int)uVar2 < (int)uVar5) {
        uVar4 = uVar3;
      }
      if ((int)uVar5 < 0) {
        uVar4 = uVar3;
      }
      uVar9 = 0;
      uVar5 = uVar10;
      do {
        iVar8 = (int)uVar4;
        if (iVar8 < (int)uVar2) {
          uVar4 = (ulong)(iVar8 + 1);
          uVar12 = (uint)puVar6[iVar8];
        }
        else {
          uVar12 = 0;
        }
        uVar9 = uVar9 << 8 | uVar12;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      uVar12 = 0;
      uVar5 = uVar10;
      do {
        iVar8 = (int)uVar4;
        if (iVar8 < (int)uVar2) {
          uVar4 = (ulong)(iVar8 + 1);
          uVar13 = (uint)puVar6[iVar8];
        }
        else {
          uVar13 = 0;
        }
        uVar12 = uVar12 << 8 | uVar13;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  else {
    uVar9 = 0;
    uVar12 = 0;
  }
  uVar1 = (uVar1 + 1) * uVar10 + uVar9 + 2;
  uVar12 = uVar12 - uVar9;
  if (-1 < (int)(uVar12 | uVar1)) {
    puVar7 = (uchar *)0x0;
    if ((int)uVar1 <= (int)uVar2) {
      lVar11 = 0;
      if ((int)uVar12 <= (int)(uVar2 - uVar1)) {
        puVar7 = puVar6 + uVar1;
        lVar11 = (ulong)uVar12 << 0x20;
      }
      sVar14.cursor = (int)lVar11;
      sVar14.size = (int)((ulong)lVar11 >> 0x20);
      sVar14.data = puVar7;
      return sVar14;
    }
  }
  return (stbtt__buf)ZEXT816(0);
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}